

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalDistributionLayerParams::Clear
          (CategoricalDistributionLayerParams *this)

{
  *(undefined8 *)((long)&this->numsamples_ + 4) = 0;
  this->eps_ = 0.0;
  this->temperature_ = 0.0;
  this->seed_ = 0;
  this->numsamples_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CategoricalDistributionLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CategoricalDistributionLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&seed_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&temperature_) -
      reinterpret_cast<char*>(&seed_)) + sizeof(temperature_));
  _internal_metadata_.Clear<std::string>();
}